

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
Computed_Colors_Record_Data::Computed_Colors_Record_Data
          (Computed_Colors_Record_Data *this,Computed_Colors_Record_Data *prev)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e4328;
  Am_Style::Am_Style(&this->key);
  Am_Style::Am_Style(&this->foreground_style);
  Am_Style::Am_Style(&this->background_style);
  Am_Style::Am_Style(&this->shadow_style);
  Am_Style::Am_Style(&this->highlight_style);
  Am_Style::Am_Style(&this->highlight2_style);
  Am_Style::operator=(&this->key,&prev->key);
  Am_Style::operator=(&this->foreground_style,&prev->foreground_style);
  Am_Style::operator=(&this->background_style,&prev->background_style);
  Am_Style::operator=(&this->shadow_style,&prev->shadow_style);
  Am_Style::operator=(&this->highlight_style,&prev->highlight_style);
  Am_Style::operator=(&this->highlight2_style,&prev->highlight2_style);
  this->light = prev->light;
  return;
}

Assistant:

Computed_Colors_Record_Data::Computed_Colors_Record_Data(
    Computed_Colors_Record_Data *prev)
{
  key = prev->key;
  foreground_style = prev->foreground_style;
  background_style = prev->background_style;
  shadow_style = prev->shadow_style;
  highlight_style = prev->highlight_style;
  highlight2_style = prev->highlight2_style;
  light = prev->light;
}